

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryAfter(Normalizer2Impl *this,UChar32 c,UBool onlyContiguous)

{
  uint16_t norm16;
  UBool UVar1;
  
  norm16 = getNorm16(this,c);
  UVar1 = norm16HasCompBoundaryAfter(this,norm16,onlyContiguous);
  return UVar1;
}

Assistant:

UBool hasCompBoundaryAfter(UChar32 c, UBool onlyContiguous) const {
        return norm16HasCompBoundaryAfter(getNorm16(c), onlyContiguous);
    }